

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstracttxout.cpp
# Opt level: O3

void __thiscall
AbstractTxOut_ConstractorGetterSetter_Test::TestBody
          (AbstractTxOut_ConstractorGetterSetter_Test *this)

{
  _Alloc_hider _Var1;
  bool bVar2;
  char *pcVar3;
  Amount AVar4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_7;
  AbstractTxOut actual;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [56];
  Script local_b0;
  internal local_78 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  AbstractTxOut local_68;
  
  cfd::core::AbstractTxOut::AbstractTxOut(&local_68,&expect_value,&expect_locking_script);
  AVar4 = cfd::core::AbstractTxOut::GetValue(&local_68);
  local_e8._0_8_ = AVar4.amount_;
  local_e8[8] = AVar4.ignore_check_;
  testing::internal::CmpHelperEQ<cfd::core::Amount,cfd::core::Amount>
            ((internal *)&local_b0,"expect_value","actual.GetValue()",&expect_value,
             (Amount *)local_e8);
  if ((char)local_b0._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_e8);
    if (local_b0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b0.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstracttxout.cpp"
               ,0x16,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_118,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_118);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_e8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_e8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b0.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  _Var1 = expect_script_hex_abi_cxx11_._M_dataplus;
  cfd::core::AbstractTxOut::GetLockingScript((Script *)local_e8,&local_68);
  cfd::core::Script::GetScript(&local_b0,(Script *)local_e8);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_118,&local_b0);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_f8,"expect_script_hex.c_str()",
             "actual.GetLockingScript().GetScript().GetHex().c_str()",_Var1._M_p,
             (char *)local_118._0_8_);
  if ((AssertHelperData *)local_118._0_8_ != (AssertHelperData *)local_108) {
    operator_delete((void *)local_118._0_8_);
  }
  cfd::core::Script::~Script(&local_b0);
  cfd::core::Script::~Script((Script *)local_e8);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if ((undefined8 *)CONCAT71(local_f8._9_7_,local_f8[8]) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(local_f8._9_7_,local_f8[8]);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstracttxout.cpp"
               ,0x18,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
    if (CONCAT71(local_b0._vptr_Script._1_7_,(char)local_b0._vptr_Script) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT71(local_b0._vptr_Script._1_7_,(char)local_b0._vptr_Script) != (long *)0x0))
      {
        (**(code **)(*(long *)CONCAT71(local_b0._vptr_Script._1_7_,(char)local_b0._vptr_Script) + 8)
        )();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68._vptr_AbstractTxOut = (_func_int **)&PTR__AbstractTxOut_00691588;
  cfd::core::Script::~Script(&local_68.locking_script_);
  cfd::core::AbstractTxOut::AbstractTxOut(&local_68,&expect_locking_script);
  local_118._0_8_ = (ulong)(uint)local_118._4_4_ << 0x20;
  AVar4 = cfd::core::AbstractTxOut::GetValue(&local_68);
  local_e8._0_8_ = AVar4.amount_;
  local_e8[8] = AVar4.ignore_check_;
  testing::internal::CmpHelperEQ<int,cfd::core::Amount>
            ((internal *)&local_b0,"0","actual.GetValue()",(int *)local_118,(Amount *)local_e8);
  if ((char)local_b0._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_e8);
    if (local_b0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b0.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstracttxout.cpp"
               ,0x1d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_118,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_118);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_e8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_e8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b0.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  _Var1 = expect_script_hex_abi_cxx11_._M_dataplus;
  cfd::core::AbstractTxOut::GetLockingScript((Script *)local_e8,&local_68);
  cfd::core::Script::GetScript(&local_b0,(Script *)local_e8);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_118,&local_b0);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_f8,"expect_script_hex.c_str()",
             "actual.GetLockingScript().GetScript().GetHex().c_str()",_Var1._M_p,
             (char *)local_118._0_8_);
  if ((AssertHelperData *)local_118._0_8_ != (AssertHelperData *)local_108) {
    operator_delete((void *)local_118._0_8_);
  }
  cfd::core::Script::~Script(&local_b0);
  cfd::core::Script::~Script((Script *)local_e8);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if ((undefined8 *)CONCAT71(local_f8._9_7_,local_f8[8]) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(local_f8._9_7_,local_f8[8]);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstracttxout.cpp"
               ,0x1f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
    if (CONCAT71(local_b0._vptr_Script._1_7_,(char)local_b0._vptr_Script) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT71(local_b0._vptr_Script._1_7_,(char)local_b0._vptr_Script) != (long *)0x0))
      {
        (**(code **)(*(long *)CONCAT71(local_b0._vptr_Script._1_7_,(char)local_b0._vptr_Script) + 8)
        )();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68._vptr_AbstractTxOut = (_func_int **)&PTR__AbstractTxOut_00691588;
  cfd::core::Script::~Script(&local_68.locking_script_);
  cfd::core::AbstractTxOut::AbstractTxOut(&local_68);
  AVar4 = cfd::core::Amount::CreateBySatoshiAmount(0);
  local_e8._0_8_ = AVar4.amount_;
  local_e8[8] = AVar4.ignore_check_;
  AVar4 = cfd::core::AbstractTxOut::GetValue(&local_68);
  local_118._0_8_ = AVar4.amount_;
  local_118[8] = AVar4.ignore_check_;
  testing::internal::CmpHelperEQ<cfd::core::Amount,cfd::core::Amount>
            ((internal *)&local_b0,"Amount::CreateBySatoshiAmount(0)","actual.GetValue()",
             (Amount *)local_e8,(Amount *)local_118);
  if ((char)local_b0._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_e8);
    if (local_b0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b0.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstracttxout.cpp"
               ,0x24,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_118,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_118);
    if ((AssertHelperData *)local_e8._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_e8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b0.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxOut::GetLockingScript((Script *)local_e8,&local_68);
  cfd::core::Script::GetScript(&local_b0,(Script *)local_e8);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_118,&local_b0);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_f8,"\"\"","actual.GetLockingScript().GetScript().GetHex().c_str()",""
             ,(char *)local_118._0_8_);
  if ((AssertHelperData *)local_118._0_8_ != (AssertHelperData *)local_108) {
    operator_delete((void *)local_118._0_8_);
  }
  cfd::core::Script::~Script(&local_b0);
  cfd::core::Script::~Script((Script *)local_e8);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if ((undefined8 *)CONCAT71(local_f8._9_7_,local_f8[8]) != (undefined8 *)0x0) {
      pcVar3 = *(char **)CONCAT71(local_f8._9_7_,local_f8[8]);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstracttxout.cpp"
               ,0x25,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
    if (CONCAT71(local_b0._vptr_Script._1_7_,(char)local_b0._vptr_Script) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT71(local_b0._vptr_Script._1_7_,(char)local_b0._vptr_Script) != (long *)0x0))
      {
        (**(code **)(*(long *)CONCAT71(local_b0._vptr_Script._1_7_,(char)local_b0._vptr_Script) + 8)
        )();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68._vptr_AbstractTxOut = (_func_int **)&PTR__AbstractTxOut_00691588;
  cfd::core::Script::~Script(&local_68.locking_script_);
  cfd::core::AbstractTxOut::AbstractTxOut(&local_68);
  AVar4 = cfd::core::Amount::CreateBySatoshiAmount(10);
  local_f8._0_8_ = AVar4.amount_;
  local_f8[8] = AVar4.ignore_check_;
  cfd::core::AbstractTxOut::SetValue(&local_68,(Amount *)local_f8);
  AVar4 = cfd::core::AbstractTxOut::GetValue(&local_68);
  local_e8._0_8_ = AVar4.amount_;
  local_e8[8] = AVar4.ignore_check_;
  testing::internal::CmpHelperEQ<cfd::core::Amount,cfd::core::Amount>
            ((internal *)&local_b0,"amt","actual.GetValue()",(Amount *)local_f8,(Amount *)local_e8);
  if ((char)local_b0._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_e8);
    if (local_b0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b0.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstracttxout.cpp"
               ,0x2c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_118,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_118);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_e8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_e8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b0.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxOut::GetLockingScript((Script *)local_e8,&local_68);
  cfd::core::Script::GetScript(&local_b0,(Script *)local_e8);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_118,&local_b0);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            (local_78,"\"\"","actual.GetLockingScript().GetScript().GetHex().c_str()","",
             (char *)local_118._0_8_);
  if ((AssertHelperData *)local_118._0_8_ != (AssertHelperData *)local_108) {
    operator_delete((void *)local_118._0_8_);
  }
  cfd::core::Script::~Script(&local_b0);
  cfd::core::Script::~Script((Script *)local_e8);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_70.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_70.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstracttxout.cpp"
               ,0x2d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
    if (CONCAT71(local_b0._vptr_Script._1_7_,(char)local_b0._vptr_Script) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT71(local_b0._vptr_Script._1_7_,(char)local_b0._vptr_Script) != (long *)0x0))
      {
        (**(code **)(*(long *)CONCAT71(local_b0._vptr_Script._1_7_,(char)local_b0._vptr_Script) + 8)
        )();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68._vptr_AbstractTxOut = (_func_int **)&PTR__AbstractTxOut_00691588;
  cfd::core::Script::~Script(&local_68.locking_script_);
  return;
}

Assistant:

TEST(AbstractTxOut, ConstractorGetterSetter) {
  {
    AbstractTxOut actual = AbstractTxOut(expect_value, expect_locking_script);
    EXPECT_EQ(expect_value, actual.GetValue());
    EXPECT_STREQ(expect_script_hex.c_str(),
                 actual.GetLockingScript().GetScript().GetHex().c_str());
  }

  {
    AbstractTxOut actual = AbstractTxOut(expect_locking_script);
    EXPECT_EQ(0, actual.GetValue());
    EXPECT_STREQ(expect_script_hex.c_str(),
                 actual.GetLockingScript().GetScript().GetHex().c_str());
  }

  {
    AbstractTxOut actual = AbstractTxOut();
    EXPECT_EQ(Amount::CreateBySatoshiAmount(0), actual.GetValue());
    EXPECT_STREQ("", actual.GetLockingScript().GetScript().GetHex().c_str());
  }

  {
    AbstractTxOut actual = AbstractTxOut();
    Amount amt = Amount::CreateBySatoshiAmount(int64_t{10});
    actual.SetValue(amt);
    EXPECT_EQ(amt, actual.GetValue());
    EXPECT_STREQ("", actual.GetLockingScript().GetScript().GetHex().c_str());
  }
}